

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O2

bool __thiscall SocketInternals::Close(SocketInternals *this)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  bool bVar4;
  
  bVar4 = true;
  if (this->SocketFD != -1) {
    iVar1 = close(this->SocketFD);
    if (iVar1 == 0) {
      this->SocketFD = -1;
    }
    else {
      poVar2 = std::operator<<(this->outStr,"Close: failed to close socket, Error: ");
      piVar3 = __errno_location();
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool SocketInternals::Close()
{
    if (SocketFD != INVALID_SOCKET) {
#ifdef _MSC_VER
        if (closesocket(SocketFD) != 0) {
            outStr << "Close: failed to close socket, Error: " << WSAGetLastError() <<std::endl;
            return false;
        }
        WSACleanup();
#else
        if (close(SocketFD) != 0) {
            outStr << "Close: failed to close socket, Error: " << errno << std::endl;
            return false;
        }
#endif
        SocketFD = INVALID_SOCKET;
    }
    return true;
}